

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O1

uint64_t bitmanip::detail::remIleavedBits_shift<6u>(uint64_t input)

{
  ulong uVar1;
  size_t i;
  long lVar2;
  uint64_t MASKS [6];
  
  MASKS[1] = 0x3000c003000c003;
  MASKS[2] = 0xf000000f000000f;
  MASKS[3] = 0xff000000000000ff;
  MASKS[4] = 0xffff;
  uVar1 = input & 0x8102040810204081;
  lVar2 = 0;
  do {
    uVar1 = (uVar1 | uVar1 >> ((byte)(6 << ((byte)lVar2 & 0x1f)) & 0x3f)) & MASKS[lVar2 + 1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return uVar1;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t remIleavedBits_shift(std::uint64_t input) noexcept
{
    if constexpr (BITS == 0) {
        return input;
    }
    else {
        constexpr std::uint64_t MASKS[] = {
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 1),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 2),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 4),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 8),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 16),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 32),
        };
        // log2_floor(0) == 0 so this is always safe, even for 1 bit
        constexpr std::size_t iterations = 5 - bitmanip::log2floor(BITS >> 1);

        input &= MASKS[0];

        for (std::size_t i = 0; i < iterations; ++i) {
            unsigned rshift = (1u << i) * BITS;
            input |= input >> rshift;
            input &= MASKS[i + 1];
        }

        return input;
    }
}